

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O0

int BUF_MEM_reserve(BUF_MEM *buf,size_t cap)

{
  ulong uVar1;
  char *pcVar2;
  char *new_buf;
  size_t alloc_size;
  size_t n;
  size_t cap_local;
  BUF_MEM *buf_local;
  
  if (buf->max < cap) {
    if (cap + 3 < cap) {
      ERR_put_error(7,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf.cc"
                    ,0x2c);
      buf_local._4_4_ = 0;
    }
    else {
      uVar1 = (cap + 3) / 3;
      if ((uVar1 & 0x3fffffffffffffff) == uVar1) {
        pcVar2 = (char *)OPENSSL_realloc(buf->data,uVar1 << 2);
        if (pcVar2 == (char *)0x0) {
          buf_local._4_4_ = 0;
        }
        else {
          buf->data = pcVar2;
          buf->max = uVar1 << 2;
          buf_local._4_4_ = 1;
        }
      }
      else {
        ERR_put_error(7,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf.cc"
                      ,0x32);
        buf_local._4_4_ = 0;
      }
    }
  }
  else {
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

int BUF_MEM_reserve(BUF_MEM *buf, size_t cap) {
  if (buf->max >= cap) {
    return 1;
  }

  size_t n = cap + 3;
  if (n < cap) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }
  n = n / 3;
  size_t alloc_size = n * 4;
  if (alloc_size / 4 != n) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }

  char *new_buf =
      reinterpret_cast<char *>(OPENSSL_realloc(buf->data, alloc_size));
  if (new_buf == NULL) {
    return 0;
  }

  buf->data = new_buf;
  buf->max = alloc_size;
  return 1;
}